

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  _Bool _Var5;
  size_t n;
  long lVar6;
  uint uVar7;
  size_t n_1;
  uint32_t letter_counts [26];
  char word [1024];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  char local_418;
  char local_417 [1023];
  
  local_438 = 0;
  uStack_430 = 0;
  local_448 = 0;
  uStack_440 = 0;
  local_458 = 0;
  uStack_450 = 0;
  local_468 = 0;
  uStack_460 = 0;
  local_478 = 0;
  uStack_470 = 0;
  local_488 = 0;
  uStack_480 = 0;
  local_428 = 0;
  _Var5 = ask_word(&local_418,6,0x400);
  if (_Var5) {
    pcVar4 = local_417;
    cVar2 = local_418;
    do {
      while (cVar2 != '\0') {
        if ((byte)(cVar2 + 0xbfU) < 0x1a) {
          piVar1 = (int *)((long)&local_488 + (ulong)(byte)(cVar2 + 0xbfU) * 4);
          *piVar1 = *piVar1 + 1;
        }
        cVar2 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      }
      _Var5 = ask_word(&local_418,6,0x400);
      pcVar4 = local_417;
      cVar2 = local_418;
    } while (_Var5);
  }
  lVar6 = 0;
  uVar7 = (uint)local_488;
  do {
    uVar3 = *(uint *)((long)&local_488 + lVar6 * 4);
    if (uVar7 < uVar3) {
      uVar7 = uVar3;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1a);
  printf("The most used letters are ");
  lVar6 = 0;
  do {
    if (*(uint *)((long)&local_488 + lVar6 * 4) == uVar7) {
      printf("%c ",(ulong)((int)lVar6 + 0x41));
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1a);
  printf("\nEach are used %u times.\n",(ulong)uVar7);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word[1024];
  uint32_t letter_counts[26];

  for (size_t n = 0; n < 26; n++) letter_counts[n] = 0;

  while (ask_word(word, 6, sizeof word)) {
    count_letters(letter_counts, word);
  }

  uint32_t max = max_count(letter_counts);

  printf("The most used letters are ");
  for (size_t n = 0; n < 26; n++) {
    if (letter_counts[n] == max) printf("%c ", 'A' + (char)n);
  }
  printf("\nEach are used %" PRIu32 " times.\n", max);

  return 0;
}